

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrROL0x2e(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t uVar2;
  byte value;
  
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this->m,uVar2);
  this_00 = this->m;
  bVar1 = Memory::Read8(this_00,uVar2);
  value = (byte)this->field_0x2e >> 7 | bVar1 * '\x02';
  this->field_0x2e =
       (byte)(bVar1 * '\x02') >> 7 | bVar1 & 0x80 | this->field_0x2e & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,uVar2,value);
  return 6;
}

Assistant:

int CPU::instrROL0x2e() {
	uint16_t address = absolute_addr_j();
	m->Write8(address, ROL(m->Read8(address)));
	return 6;
}